

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_array_container_lazy_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  undefined4 *puVar1;
  int size;
  array_container_t *paVar2;
  bitset_container_t *pbVar3;
  bitset_container_t *ourbitset;
  _Bool returnval;
  int totalCardinality;
  container_t **dst_local;
  array_container_t *src_2_local;
  array_container_t *src_1_local;
  
  size = src_1->cardinality + src_2->cardinality;
  if (size < 0x401) {
    paVar2 = array_container_create_given_capacity(size);
    *dst = paVar2;
    if (*dst == (container_t *)0x0) {
      src_1_local._7_1_ = true;
    }
    else {
      array_container_union(src_1,src_2,(array_container_t *)*dst);
      src_1_local._7_1_ = false;
    }
  }
  else {
    pbVar3 = bitset_container_create();
    *dst = pbVar3;
    if (*dst != (container_t *)0x0) {
      puVar1 = (undefined4 *)*dst;
      bitset_set_list(*(uint64_t **)(puVar1 + 2),src_1->array,(long)src_1->cardinality);
      bitset_set_list(*(uint64_t **)(puVar1 + 2),src_2->array,(long)src_2->cardinality);
      *puVar1 = 0xffffffff;
    }
    src_1_local._7_1_ = true;
  }
  return src_1_local._7_1_;
}

Assistant:

bool array_array_container_lazy_union(
    const array_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    if (totalCardinality <= ARRAY_LAZY_LOWERBOUND) {
        *dst = array_container_create_given_capacity(totalCardinality);
        if (*dst != NULL) {
            array_container_union(src_1, src_2, CAST_array(*dst));
        } else {
              return true; // otherwise failure won't be caught
        }
        return false;  // not a bitset
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        bitset_set_list(ourbitset->words, src_2->array, src_2->cardinality);
        ourbitset->cardinality = BITSET_UNKNOWN_CARDINALITY;
    }
    return returnval;
}